

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

Offset wabt::WriteU32Leb128Raw(uint8_t *dest,uint8_t *dest_end,uint32_t value)

{
  byte bVar1;
  long lStack_38;
  uint8_t byte;
  Offset length;
  undefined1 auStack_24 [3];
  uint8_t data [5];
  uint32_t value_local;
  uint8_t *dest_end_local;
  uint8_t *dest_local;
  
  lStack_38 = 0;
  _auStack_24 = value;
  unique0x10000096 = dest_end;
  while( true ) {
    bVar1 = (byte)_auStack_24 & 0x7f;
    _auStack_24 = _auStack_24 >> 7;
    if (_auStack_24 == 0) break;
    *(byte *)((long)&length + lStack_38 + 7) = bVar1 | 0x80;
    lStack_38 = lStack_38 + 1;
  }
  dest_local = (uint8_t *)(lStack_38 + 1);
  *(byte *)((long)&length + lStack_38 + 7) = bVar1;
  if (stack0xffffffffffffffe0 + -(long)dest < dest_local) {
    dest_local = (uint8_t *)0x0;
  }
  else {
    memcpy(dest,(void *)((long)&length + 7),(size_t)dest_local);
  }
  return (Offset)dest_local;
}

Assistant:

Offset WriteU32Leb128Raw(uint8_t* dest, uint8_t* dest_end, uint32_t value) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length = 0;
  LEB128_LOOP_UNTIL(value == 0);
  if (static_cast<Offset>(dest_end - dest) < length) {
    return 0;
  }
  memcpy(dest, data, length);
  return length;
}